

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase326::run(TestCase326 *this)

{
  uint uVar1;
  PromiseFulfiller<void> *pPVar2;
  bool local_8b;
  undefined1 local_8a;
  bool local_89;
  undefined1 local_88 [5];
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  PromiseFulfillerPair<void> pair;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase326 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  newPromiseAndFulfiller<void>();
  pPVar2 = Own<kj::PromiseFulfiller<void>_>::operator->
                     ((Own<kj::PromiseFulfiller<void>_> *)&pair.promise.super_PromiseBase.node.ptr);
  uVar1 = (*pPVar2->_vptr_PromiseFulfiller[2])();
  if ((uVar1 & 1) == 0) {
    local_89 = _::Debug::shouldLog(ERROR);
    while (local_89 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x14c,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\"",
                 (char (*) [45])"failed: expected pair.fulfiller->isWaiting()");
      local_89 = false;
    }
  }
  pPVar2 = Own<kj::PromiseFulfiller<void>_>::operator->
                     ((Own<kj::PromiseFulfiller<void>_> *)&pair.promise.super_PromiseBase.node.ptr);
  (**pPVar2->_vptr_PromiseFulfiller)(pPVar2,&local_8a);
  pPVar2 = Own<kj::PromiseFulfiller<void>_>::operator->
                     ((Own<kj::PromiseFulfiller<void>_> *)&pair.promise.super_PromiseBase.node.ptr);
  uVar1 = (*pPVar2->_vptr_PromiseFulfiller[2])();
  if ((uVar1 & 1) != 0) {
    local_8b = _::Debug::shouldLog(ERROR);
    while (local_8b != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x14e,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\"",
                 (char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())");
      local_8b = false;
    }
  }
  Promise<void>::wait((Promise<void> *)local_88,local_58);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_88);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerVoid) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill();
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  pair.promise.wait(waitScope);
}